

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void server_connect_ppl(server *srv,PacketProtocolLayer *ppl)

{
  ppl->bpp = srv->bpp;
  ppl->logctx = srv->logctx;
  ppl->ssh = &srv->ssh;
  ppl->seat = &srv->seat;
  ppl->interactor = (Interactor *)0x0;
  ppl->remote_bugs = srv->remote_bugs;
  return;
}

Assistant:

static void server_connect_ppl(server *srv, PacketProtocolLayer *ppl)
{
    ppl->bpp = srv->bpp;
    ppl->logctx = srv->logctx;
    ppl->ssh = &srv->ssh;
    ppl->seat = &srv->seat;
    ppl->interactor = NULL;
    ppl->remote_bugs = srv->remote_bugs;
}